

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_read_string(sexp ctx,sexp in,int sentinel)

{
  sexp *ppsVar1;
  sexp psVar2;
  sexp psVar3;
  sexp_uint_t sVar4;
  uint uVar5;
  ushort **ppuVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  ulong uVar13;
  char *__src;
  char initbuf [128];
  sexp local_d8;
  char local_b8 [136];
  
  psVar2 = (in->value).type.setters;
  if (psVar2 == (sexp)0x0) {
    uVar5 = getc((FILE *)(in->value).type.getters);
  }
  else {
    psVar3 = (in->value).type.print;
    if (psVar3 < (sexp)(in->value).port.size) {
      (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
      uVar13 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
      goto LAB_00113d98;
    }
    uVar5 = sexp_buffered_read_char(ctx,in);
  }
  uVar13 = (ulong)uVar5;
LAB_00113d98:
  if ((int)uVar13 == sentinel) {
    local_d8 = (sexp)&DAT_0000003e;
    iVar12 = 0;
    sVar11 = 0x80;
    pcVar8 = local_b8;
  }
  else {
    iVar12 = 0;
    local_d8 = (sexp)&DAT_0000003e;
    sVar10 = 0x80;
    __src = local_b8;
    do {
      iVar9 = (int)uVar13;
      sVar11 = sVar10;
      pcVar8 = __src;
      if (iVar9 == 10) {
        ppsVar1 = &(in->value).type.dl;
        *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + 1);
        uVar13 = 10;
LAB_001140e2:
        lVar7 = (long)iVar12;
        iVar12 = iVar12 + 1;
        __src[lVar7] = (char)uVar13;
LAB_001140ec:
        if ((long)sVar10 <= (long)(iVar12 + 4)) {
          sVar11 = sVar10 * 2;
          pcVar8 = (char *)malloc(sVar11);
          if (pcVar8 == (char *)0x0) {
            local_d8 = (((ctx->value).type.setters)->value).type.print;
            sVar11 = sVar10;
            pcVar8 = __src;
            break;
          }
          memcpy(pcVar8,__src,(long)iVar12);
          if (sVar10 != 0x80) {
            free(__src);
          }
        }
      }
      else {
        if (iVar9 != 0x5c) {
          if (iVar9 != -1) goto LAB_001140e2;
          local_d8 = sexp_read_error(ctx,"premature end of string",(sexp)&DAT_0000023e,in);
          break;
        }
        psVar2 = (in->value).type.setters;
        if (psVar2 == (sexp)0x0) {
          uVar5 = getc((FILE *)(in->value).type.getters);
LAB_00113e37:
          uVar13 = (ulong)uVar5;
        }
        else {
          psVar3 = (in->value).type.print;
          if ((sexp)(in->value).port.size <= psVar3) {
            uVar5 = sexp_buffered_read_char(ctx,in);
            goto LAB_00113e37;
          }
          (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
          uVar13 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
        }
        iVar9 = (int)uVar13;
        if (iVar9 < 0x6e) {
          if (iVar9 == 0x58) {
LAB_00113e96:
            local_d8 = sexp_read_number(ctx,in,0x10,0);
            if (((ulong)local_d8 & 1) == 0) goto LAB_001140d1;
            psVar2 = (in->value).type.setters;
            if (psVar2 == (sexp)0x0) {
              uVar5 = getc((FILE *)(in->value).type.getters);
            }
            else {
              psVar3 = (in->value).type.print;
              if (psVar3 < (sexp)(in->value).port.size) {
                (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
                uVar5 = (uint)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
              }
              else {
                uVar5 = sexp_buffered_read_char(ctx,in);
              }
            }
            if ((uVar5 != 0xffffffff) && (uVar5 != 0x3b)) {
              sVar4 = (in->value).bytecode.max_depth;
              if (sVar4 == 0) {
                ungetc(uVar5,(FILE *)(in->value).type.getters);
              }
              else {
                psVar2 = (in->value).type.print;
                (in->value).type.print = (sexp)((long)&psVar2[-1].value + 0x60bf);
                *(char *)((sVar4 - 1) + (long)psVar2) = (char)uVar5;
              }
            }
            uVar13 = (ulong)local_d8 >> 1;
            uVar5 = (uint)uVar13;
            if (uVar5 < 0x81) goto LAB_001140d1;
            iVar9 = 1;
            if ((0x7f < (int)uVar5) && (iVar9 = 2, 0x7ff < (int)uVar5)) {
              iVar9 = (0xffff < (int)uVar5) + 3;
            }
            sexp_utf8_encode_char((uchar *)(__src + iVar12),iVar9,uVar5);
            iVar12 = iVar12 + iVar9;
            goto LAB_001140ec;
          }
          if (iVar9 == 0x61) {
            uVar13 = 7;
          }
          else {
            if (iVar9 != 0x62) goto LAB_00113ee4;
            uVar13 = 8;
          }
LAB_001140d1:
          if ((((ulong)local_d8 & 3) != 0) || (local_d8->tag != 0x13)) goto LAB_001140e2;
          break;
        }
        if (iVar9 < 0x74) {
          if (iVar9 == 0x6e) {
            uVar13 = 10;
          }
          else {
            if (iVar9 != 0x72) goto LAB_00113ee4;
            uVar13 = 0xd;
          }
          goto LAB_001140d1;
        }
        if (iVar9 == 0x74) {
          uVar13 = 9;
          goto LAB_001140d1;
        }
        if (iVar9 == 0x78) goto LAB_00113e96;
LAB_00113ee4:
        ppuVar6 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar6 + (long)iVar9 * 2 + 1) & 0x20) == 0) goto LAB_001140d1;
        while ((iVar9 = (int)uVar13, iVar9 == 9 || (iVar9 == 0x20))) {
          psVar2 = (in->value).type.setters;
          if (psVar2 == (sexp)0x0) {
            uVar5 = getc((FILE *)(in->value).type.getters);
            uVar13 = (ulong)uVar5;
          }
          else {
            psVar3 = (in->value).type.print;
            if (psVar3 < (sexp)(in->value).port.size) {
              (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
              uVar13 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
            }
            else {
              uVar5 = sexp_buffered_read_char(ctx,in);
              uVar13 = (ulong)uVar5;
            }
          }
        }
        if (iVar9 == 0xd) {
          psVar2 = (in->value).type.setters;
          if (psVar2 == (sexp)0x0) {
            uVar5 = getc((FILE *)(in->value).type.getters);
          }
          else {
            psVar3 = (in->value).type.print;
            if (psVar3 < (sexp)(in->value).port.size) {
              (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
              uVar13 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
              goto LAB_0011405e;
            }
            uVar5 = sexp_buffered_read_char(ctx,in);
          }
          uVar13 = (ulong)uVar5;
        }
LAB_0011405e:
        if ((int)uVar13 != 10) goto LAB_001140d1;
        ppsVar1 = &(in->value).type.dl;
        *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + 1);
        do {
          psVar2 = (in->value).type.setters;
          if (psVar2 == (sexp)0x0) {
            uVar5 = getc((FILE *)(in->value).type.getters);
          }
          else {
            psVar3 = (in->value).type.print;
            if (psVar3 < (sexp)(in->value).port.size) {
              (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
              uVar5 = (uint)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
            }
            else {
              uVar5 = sexp_buffered_read_char(ctx,in);
            }
          }
        } while ((uVar5 == 9) || (uVar5 == 0x20));
        if (uVar5 != 0xffffffff) {
          sVar4 = (in->value).bytecode.max_depth;
          if (sVar4 == 0) {
            ungetc(uVar5,(FILE *)(in->value).type.getters);
          }
          else {
            psVar2 = (in->value).type.print;
            (in->value).type.print = (sexp)((long)&psVar2[-1].value + 0x60bf);
            *(char *)((sVar4 - 1) + (long)psVar2) = (char)uVar5;
          }
        }
      }
      psVar2 = (in->value).type.setters;
      if (psVar2 == (sexp)0x0) {
        uVar5 = getc((FILE *)(in->value).type.getters);
LAB_0011417c:
        uVar13 = (ulong)uVar5;
      }
      else {
        psVar3 = (in->value).type.print;
        if ((sexp)(in->value).port.size <= psVar3) {
          uVar5 = sexp_buffered_read_char(ctx,in);
          goto LAB_0011417c;
        }
        (in->value).type.print = (sexp)((long)&psVar3->tag + 1);
        uVar13 = (ulong)*(byte *)((long)&psVar3->tag + (long)&psVar2->tag);
      }
      sVar10 = sVar11;
      __src = pcVar8;
    } while ((int)uVar13 != sentinel);
  }
  if ((((ulong)local_d8 & 3) != 0) || (local_d8->tag != 0x13)) {
    pcVar8[iVar12] = '\0';
    local_d8 = sexp_c_string(ctx,pcVar8,(long)iVar12);
  }
  if (sVar11 != 0x80) {
    free(pcVar8);
  }
  return local_d8;
}

Assistant:

sexp sexp_read_string (sexp ctx, sexp in, int sentinel) {
#if SEXP_USE_UTF8_STRINGS
  int len;
#endif
  int c, i=0;
  sexp_sint_t size=INIT_STRING_BUFFER_SIZE;
  char initbuf[INIT_STRING_BUFFER_SIZE];
  char *buf=initbuf, *tmp;
  sexp res = SEXP_FALSE;

  for (c = sexp_read_char(ctx, in); c != sentinel; c = sexp_read_char(ctx, in)) {
    if (c == '\\') {
      c = sexp_read_char(ctx, in);
      switch (c) {
      case 'a': c = '\a'; break;
      case 'b': c = '\b'; break;
      case 'n': c = '\n'; break;
      case 'r': c = '\r'; break;
      case 't': c = '\t'; break;
      case 'x': case 'X':
        res = sexp_read_number(ctx, in, 16, 0);
        if (sexp_fixnump(res)) {
          c = sexp_read_char(ctx, in);
          if (c != ';') {
#if SEXP_USE_ESCAPE_REQUIRES_TRAILING_SEMI_COLON
            res = sexp_read_error(ctx, "missing ; in \\x escape", SEXP_NULL, in);
#else
            sexp_push_char(ctx, c, in);
#endif
          }
          c = sexp_unbox_fixnum(res);
#if SEXP_USE_UTF8_STRINGS
          if ((unsigned)c > 0x80) {
            len = sexp_utf8_char_byte_count(c);
            sexp_utf8_encode_char((unsigned char*)buf + i, len, c);
            i += len;
            goto maybe_expand;
          }
#endif
        }
        break;
#if SEXP_USE_ESCAPE_NEWLINE
      default:
        if (isspace(c)) {
          while (c==' ' || c=='\t') c=sexp_read_char(ctx, in);
          if (c=='\r') c=sexp_read_char(ctx, in);
          if (c=='\n') {
            sexp_port_line(in)++;
            do {c=sexp_read_char(ctx, in);} while (c==' ' || c=='\t');
            sexp_push_char(ctx, c, in);
            continue;
          }
        }
#endif
      }
      if (sexp_exceptionp(res)) break;
    } else if (c == '\n') {
      sexp_port_line(in)++;
    } else if (c == EOF) {
      res = sexp_read_error(ctx, "premature end of string", SEXP_NULL, in);
      break;
    }
    buf[i++] = c;
  maybe_expand:
    if (i+4 >= size) {       /* expand buffer w/ malloc(), later free() it */
      tmp = (char*) sexp_malloc(size*2);
      if (!tmp) {res = sexp_global(ctx, SEXP_G_OOM_ERROR); break;}
      memcpy(tmp, buf, i);
      if (size != INIT_STRING_BUFFER_SIZE) free(buf);
      buf = tmp;
      size *= 2;
    }
  }

  if (!sexp_exceptionp(res)) {
    buf[i] = '\0';
    res = sexp_c_string(ctx, buf, i);
  }
  if (size != INIT_STRING_BUFFER_SIZE) free(buf);
  return res;
}